

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

void av1_inter_mode_data_fit(TileDataEnc *tile_data,int rdmult)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pdVar3 = &tile_data->inter_mode_rd_models[0].sse_ld_sum;
  lVar4 = 0;
  do {
    if (((((byte)lVar4 < 0x12 & (byte)(0x30007 >> ((byte)lVar4 & 0x1f))) == 0) &&
        ((iVar2 = ((InterModeRdModel *)(pdVar3 + -0xd))->ready, iVar2 != 0 ||
         (199 < *(int *)(pdVar3 + -5))))) && ((iVar2 != 1 || (0x3f < *(int *)(pdVar3 + -5))))) {
      if (iVar2 == 0) {
        dVar5 = (double)*(int *)(pdVar3 + -5);
        auVar7._8_8_ = dVar5;
        auVar7._0_8_ = dVar5;
        auVar8 = divpd(*(undefined1 (*) [16])(pdVar3 + -4),auVar7);
        *(undefined1 (*) [16])(pdVar3 + -10) = auVar8;
        auVar7 = divpd(*(undefined1 (*) [16])(pdVar3 + -2),auVar7);
        *(undefined1 (*) [16])(pdVar3 + -8) = auVar7;
        pdVar3[-6] = *pdVar3 / dVar5;
      }
      else {
        dVar5 = (double)*(int *)(pdVar3 + -5);
        auVar8._8_8_ = dVar5;
        auVar8._0_8_ = dVar5;
        auVar7 = divpd(*(undefined1 (*) [16])(pdVar3 + -4),auVar8);
        pdVar3[-10] = (pdVar3[-10] * 3.0 + auVar7._0_8_) * 0.25;
        pdVar3[-9] = (pdVar3[-9] * 3.0 + auVar7._8_8_) * 0.25;
        auVar7 = divpd(*(undefined1 (*) [16])(pdVar3 + -2),auVar8);
        pdVar3[-8] = (pdVar3[-8] * 3.0 + auVar7._0_8_) * 0.25;
        pdVar3[-7] = (pdVar3[-7] * 3.0 + auVar7._8_8_) * 0.25;
        pdVar3[-6] = (pdVar3[-6] * 3.0 + *pdVar3 / dVar5) * 0.25;
      }
      dVar5 = pdVar3[-9];
      dVar1 = pdVar3[-8];
      dVar6 = pdVar3[-7];
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar6 = (pdVar3[-6] - dVar1 * dVar5) / (dVar6 * dVar6 - dVar1 * dVar1);
      pdVar3[-0xc] = dVar6;
      pdVar3[-0xb] = dVar5 - dVar6 * dVar1;
      ((InterModeRdModel *)(pdVar3 + -0xd))->ready = 1;
      *(int *)(pdVar3 + -5) = 0;
      pdVar3[-4] = 0.0;
      pdVar3[-3] = 0.0;
      pdVar3[-2] = 0.0;
      pdVar3[-1] = 0.0;
      *pdVar3 = 0.0;
    }
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 0xe;
  } while (lVar4 != 0x16);
  return;
}

Assistant:

void av1_inter_mode_data_fit(TileDataEnc *tile_data, int rdmult) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    const int block_idx = inter_mode_data_block_idx(bsize);
    InterModeRdModel *md = &tile_data->inter_mode_rd_models[bsize];
    if (block_idx == -1) continue;
    if ((md->ready == 0 && md->num < 200) || (md->ready == 1 && md->num < 64)) {
      continue;
    } else {
      if (md->ready == 0) {
        md->dist_mean = md->dist_sum / md->num;
        md->ld_mean = md->ld_sum / md->num;
        md->sse_mean = md->sse_sum / md->num;
        md->sse_sse_mean = md->sse_sse_sum / md->num;
        md->sse_ld_mean = md->sse_ld_sum / md->num;
      } else {
        const double factor = 3;
        md->dist_mean =
            (md->dist_mean * factor + (md->dist_sum / md->num)) / (factor + 1);
        md->ld_mean =
            (md->ld_mean * factor + (md->ld_sum / md->num)) / (factor + 1);
        md->sse_mean =
            (md->sse_mean * factor + (md->sse_sum / md->num)) / (factor + 1);
        md->sse_sse_mean =
            (md->sse_sse_mean * factor + (md->sse_sse_sum / md->num)) /
            (factor + 1);
        md->sse_ld_mean =
            (md->sse_ld_mean * factor + (md->sse_ld_sum / md->num)) /
            (factor + 1);
      }

      const double my = md->ld_mean;
      const double mx = md->sse_mean;
      const double dx = sqrt(md->sse_sse_mean);
      const double dxy = md->sse_ld_mean;

      md->a = (dxy - mx * my) / (dx * dx - mx * mx);
      md->b = my - md->a * mx;
      md->ready = 1;

      md->num = 0;
      md->dist_sum = 0;
      md->ld_sum = 0;
      md->sse_sum = 0;
      md->sse_sse_sum = 0;
      md->sse_ld_sum = 0;
    }
    (void)rdmult;
  }
}